

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O1

string * __thiscall
svg::Circle::toString_abi_cxx11_(string *__return_storage_ptr__,Circle *this,Layout *layout)

{
  double dVar1;
  long *plVar2;
  ostream *poVar3;
  long *plVar4;
  stringstream local_390 [8];
  stringstream ss;
  ostream local_380 [112];
  ios_base local_310 [264];
  char *local_208;
  undefined8 local_200;
  char local_1f8 [16];
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  double local_88;
  double local_80;
  double local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::stringstream::stringstream(local_390);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"circle","");
  std::operator+(&local_50,"\t<",&local_148);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70 = &local_60;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar2[3];
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_380,(char *)local_70,local_68);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"cx","");
  dVar1 = (this->center).x;
  if ((layout->origin & ~BottomLeft) == TopRight) {
    local_88 = (layout->dimensions).width - (dVar1 + (layout->origin_offset).x) * layout->scale;
  }
  else {
    local_88 = (dVar1 + (layout->origin_offset).x) * layout->scale;
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  attribute<double>(&local_50,&local_128,&local_88,&local_108);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"cy","");
  dVar1 = (this->center).y;
  if ((layout->origin | TopRight) == BottomRight) {
    local_80 = (layout->dimensions).height - (dVar1 + (layout->origin_offset).y) * layout->scale;
  }
  else {
    local_80 = (dVar1 + (layout->origin_offset).y) * layout->scale;
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  attribute<double>(&local_1e8,&local_e8,&local_80,&local_c8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"r","");
  local_78 = this->radius * layout->scale;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
  attribute<double>(&local_1c8,&local_a8,&local_78,&local_1a8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  Fill::toString_abi_cxx11_(&local_188,&(this->super_Shape).fill,layout);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_188._M_dataplus._M_p,local_188._M_string_length);
  Stroke::toString_abi_cxx11_(&local_168,&(this->super_Shape).stroke,layout);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_168._M_dataplus._M_p,local_168._M_string_length);
  builtin_strncpy(local_1f8,"/>\n",4);
  local_200 = 3;
  local_208 = local_1f8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_1f8,3);
  if (local_208 != local_1f8) {
    operator_delete(local_208);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_390);
  std::ios_base::~ios_base(local_310);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << elemStart("circle") << attribute("cx", translateX(center.x, layout))
                << attribute("cy", translateY(center.y, layout))
                << attribute("r", translateScale(radius, layout)) << fill.toString(layout)
                << stroke.toString(layout) << emptyElemEnd();
            return ss.str();
        }